

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkLevelReverse_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  int local_24;
  int Level;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNet(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x56d,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsCo(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode(pNode);
    if ((iVar1 == 0) && ((*(uint *)&pNode->field_0x14 & 0xf) != 1)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x571,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xfff;
      for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pAVar3 = Abc_ObjFanout(pNode,local_24);
        pAVar3 = Abc_ObjFanout0Ntk(pAVar3);
        uVar2 = Abc_NtkLevelReverse_rec(pAVar3);
        if (*(uint *)&pNode->field_0x14 >> 0xc < uVar2) {
          *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xfff | uVar2 << 0xc;
        }
      }
      iVar1 = Abc_ObjFaninNum(pNode);
      if ((0 < iVar1) && (iVar1 = Abc_ObjIsBarBuf(pNode), iVar1 == 0)) {
        *(uint *)&pNode->field_0x14 =
             *(uint *)&pNode->field_0x14 & 0xfff |
             ((*(uint *)&pNode->field_0x14 >> 0xc) + 1) * 0x1000;
      }
      pNode_local._4_4_ = *(uint *)&pNode->field_0x14 >> 0xc;
    }
    else {
      pNode_local._4_4_ = *(uint *)&pNode->field_0x14 >> 0xc;
    }
  }
  else {
    pNode_local._4_4_ = *(uint *)&pNode->field_0x14 >> 0xc;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkLevelReverse_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNext;
    int i, Level;
    assert( !Abc_ObjIsNet(pNode) );
    // skip the PI
    if ( Abc_ObjIsCo(pNode) )
        return pNode->Level;
    assert( Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1);
    // if this node is already visited, return
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return pNode->Level;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    pNode->Level = 0;
    Abc_ObjForEachFanout( pNode, pNext, i )
    {
        Level = Abc_NtkLevelReverse_rec( Abc_ObjFanout0Ntk(pNext) );
        if ( pNode->Level < (unsigned)Level )
            pNode->Level = Level;
    }
    if ( Abc_ObjFaninNum(pNode) > 0 && !Abc_ObjIsBarBuf(pNode) )
        pNode->Level++;
    return pNode->Level;
}